

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint readChunk_iCCP(LodePNGInfo *info,LodePNGDecompressSettings *zlibsettings,uchar *data,
                   size_t chunkLength)

{
  int iVar1;
  void *pvVar2;
  ulong in_RCX;
  long in_RDX;
  long in_RDI;
  ucvector decoded;
  uint string2_begin;
  uint length;
  uint i;
  uint error;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 uVar3;
  uchar *in_stack_ffffffffffffffb0;
  uchar *in_stack_ffffffffffffffb8;
  size_t *in_stack_ffffffffffffffc0;
  uint uVar4;
  uint local_30;
  uint local_2c;
  uint local_4;
  
  *(undefined4 *)(in_RDI + 0xe8) = 1;
  if (*(long *)(in_RDI + 0xf0) != 0) {
    lodepng_clear_icc((LodePNGInfo *)0x115498);
  }
  uVar4 = 0;
  while( true ) {
    uVar3 = false;
    if (uVar4 < in_RCX) {
      uVar3 = *(char *)(in_RDX + (ulong)uVar4) != '\0';
    }
    if ((bool)uVar3 == false) break;
    uVar4 = uVar4 + 1;
  }
  if (uVar4 + 2 < in_RCX) {
    if ((uVar4 == 0) || (0x4f < uVar4)) {
      local_4 = 0x59;
    }
    else {
      pvVar2 = lodepng_malloc(0x11552b);
      *(void **)(in_RDI + 0xf0) = pvVar2;
      if (*(long *)(in_RDI + 0xf0) == 0) {
        local_4 = 0x53;
      }
      else {
        *(undefined1 *)(*(long *)(in_RDI + 0xf0) + (ulong)uVar4) = 0;
        for (local_30 = 0; local_30 != uVar4; local_30 = local_30 + 1) {
          *(undefined1 *)(*(long *)(in_RDI + 0xf0) + (ulong)local_30) =
               *(undefined1 *)(in_RDX + (ulong)local_30);
        }
        if (*(char *)(in_RDX + (ulong)(uVar4 + 1)) == '\0') {
          uVar4 = uVar4 + 2;
          if (in_RCX < uVar4) {
            local_4 = 0x4b;
          }
          else {
            iVar1 = (int)in_RCX - uVar4;
            ucvector_init((ucvector *)&stack0xffffffffffffffb0);
            local_2c = zlib_decompress((uchar **)CONCAT44(iVar1,uVar4),in_stack_ffffffffffffffc0,
                                       in_stack_ffffffffffffffb8,(size_t)in_stack_ffffffffffffffb0,
                                       (LodePNGDecompressSettings *)
                                       CONCAT17(uVar3,in_stack_ffffffffffffffa8));
            if (local_2c == 0) {
              *(int *)(in_RDI + 0x100) = (int)in_stack_ffffffffffffffb8;
              pvVar2 = lodepng_malloc(0x115657);
              *(void **)(in_RDI + 0xf8) = pvVar2;
              if (*(long *)(in_RDI + 0xf8) == 0) {
                local_2c = 0x53;
              }
              else {
                memcpy(*(void **)(in_RDI + 0xf8),in_stack_ffffffffffffffb0,
                       (size_t)in_stack_ffffffffffffffb8);
              }
            }
            ucvector_cleanup((void *)0x1156a6);
            local_4 = local_2c;
          }
        }
        else {
          local_4 = 0x48;
        }
      }
    }
  }
  else {
    local_4 = 0x4b;
  }
  return local_4;
}

Assistant:

static unsigned readChunk_iCCP(LodePNGInfo* info, const LodePNGDecompressSettings* zlibsettings,
                               const unsigned char* data, size_t chunkLength)
{
  unsigned error = 0;
  unsigned i;

  unsigned length, string2_begin;
  ucvector decoded;

  info->iccp_defined = 1;
  if(info->iccp_name) lodepng_clear_icc(info);

  for(length = 0; length < chunkLength && data[length] != 0; ++length) ;
  if(length + 2 >= chunkLength) return 75; /*no null termination, corrupt?*/
  if(length < 1 || length > 79) return 89; /*keyword too short or long*/

  info->iccp_name = (char*)lodepng_malloc(length + 1);
  if(!info->iccp_name) return 83; /*alloc fail*/

  info->iccp_name[length] = 0;
  for(i = 0; i != length; ++i) info->iccp_name[i] = (char)data[i];

  if(data[length + 1] != 0) return 72; /*the 0 byte indicating compression must be 0*/

  string2_begin = length + 2;
  if(string2_begin > chunkLength) return 75; /*no null termination, corrupt?*/

  length = (unsigned)chunkLength - string2_begin;
  ucvector_init(&decoded);
  error = zlib_decompress(&decoded.data, &decoded.size,
                          (unsigned char*)(&data[string2_begin]),
                          length, zlibsettings);
  if(!error) {
    info->iccp_profile_size = decoded.size;
    info->iccp_profile = (unsigned char*)lodepng_malloc(decoded.size);
    if(info->iccp_profile) {
      memcpy(info->iccp_profile, decoded.data, decoded.size);
    } else {
      error = 83; /* alloc fail */
    }
  }
  ucvector_cleanup(&decoded);
  return error;
}